

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueUInt8::read(PLYValueUInt8 *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t sVar1;
  
  sVar1 = std::streambuf::sbumpc();
  this->value = (uchar)sVar1;
  return sVar1;
}

Assistant:

void read(std::streambuf *in) { value=static_cast<unsigned char>(in->sbumpc()); }